

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaFalse.c
# Opt level: O0

Gia_Man_t *
Gia_ManCheckFalse2(Gia_Man_t *p,int nSlackMax,int nTimeOut,int fVerbose,int fVeryVerbose)

{
  int iVar1;
  uint uVar2;
  Vec_Flt_t *p_00;
  Vec_Que_t *p_01;
  float **pCosts;
  Gia_Obj_t *pGVar3;
  Vec_Wec_t *p_02;
  Gia_Man_t *pGVar4;
  bool bVar5;
  float fVar6;
  int local_4c;
  Gia_Obj_t *pGStack_48;
  int i;
  Gia_Obj_t *pObj;
  Vec_Flt_t *vWeights;
  Vec_Que_t *vPrio;
  Vec_Wec_t *vHooks;
  Gia_Man_t *pNew;
  int fVeryVerbose_local;
  int fVerbose_local;
  int nTimeOut_local;
  int nSlackMax_local;
  Gia_Man_t *p_local;
  
  Gia_ManLevelNum(p);
  iVar1 = Gia_ManCoNum(p);
  p_00 = Vec_FltAlloc(iVar1);
  local_4c = 0;
  while( true ) {
    iVar1 = Vec_IntSize(p->vCos);
    bVar5 = false;
    if (local_4c < iVar1) {
      pGStack_48 = Gia_ManCo(p,local_4c);
      bVar5 = pGStack_48 != (Gia_Obj_t *)0x0;
    }
    if (!bVar5) break;
    iVar1 = Gia_ObjLevel(p,pGStack_48);
    Vec_FltPush(p_00,(float)iVar1);
    local_4c = local_4c + 1;
  }
  iVar1 = Gia_ManCoNum(p);
  p_01 = Vec_QueAlloc(iVar1);
  pCosts = Vec_FltArrayP(p_00);
  Vec_QueSetPriority(p_01,pCosts);
  local_4c = 0;
  while( true ) {
    iVar1 = Vec_IntSize(p->vCos);
    bVar5 = false;
    if (local_4c < iVar1) {
      pGVar3 = Gia_ManCo(p,local_4c);
      bVar5 = pGVar3 != (Gia_Obj_t *)0x0;
    }
    if (!bVar5) break;
    Vec_QuePush(p_01,local_4c);
    local_4c = local_4c + 1;
  }
  iVar1 = Gia_ManObjNum(p);
  p_02 = Vec_WecStart(iVar1);
  while( true ) {
    fVar6 = Vec_QueTopPriority(p_01);
    if (fVar6 < (float)(p->nLevels - nSlackMax)) break;
    iVar1 = Vec_QuePop(p_01);
    Gia_ManCheckFalseOne(p,iVar1,nTimeOut,p_02,fVerbose,fVeryVerbose);
  }
  if (fVerbose != 0) {
    uVar2 = Vec_WecSizeUsed(p_02);
    printf("Collected %d non-overlapping false paths.\n",(ulong)uVar2);
  }
  pGVar4 = Gia_ManFalseRebuild(p,p_02,fVerbose,fVeryVerbose);
  Vec_WecFree(p_02);
  Vec_FltFree(p_00);
  Vec_QueFree(p_01);
  return pGVar4;
}

Assistant:

Gia_Man_t * Gia_ManCheckFalse2( Gia_Man_t * p, int nSlackMax, int nTimeOut, int fVerbose, int fVeryVerbose )
{
    Gia_Man_t * pNew;
    Vec_Wec_t * vHooks;
    Vec_Que_t * vPrio;
    Vec_Flt_t * vWeights;
    Gia_Obj_t * pObj;
    int i;
//    srand( 111 );
    Gia_ManLevelNum( p );
    // create PO weights
    vWeights = Vec_FltAlloc( Gia_ManCoNum(p) );
    Gia_ManForEachCo( p, pObj, i )
        Vec_FltPush( vWeights, Gia_ObjLevel(p, pObj) );
    // put POs into the queue
    vPrio = Vec_QueAlloc( Gia_ManCoNum(p) );
    Vec_QueSetPriority( vPrio, Vec_FltArrayP(vWeights) );
    Gia_ManForEachCo( p, pObj, i )
        Vec_QuePush( vPrio, i );
    // work on each PO in the queue
    vHooks = Vec_WecStart( Gia_ManObjNum(p) );
    while ( Vec_QueTopPriority(vPrio) >= p->nLevels - nSlackMax )
        Gia_ManCheckFalseOne( p, Vec_QuePop(vPrio), nTimeOut, vHooks, fVerbose, fVeryVerbose );
    if ( fVerbose )
    printf( "Collected %d non-overlapping false paths.\n", Vec_WecSizeUsed(vHooks) );
    // reconstruct the AIG
    pNew = Gia_ManFalseRebuild( p, vHooks, fVerbose, fVeryVerbose );
    // cleanup
    Vec_WecFree( vHooks );
    Vec_FltFree( vWeights );
    Vec_QueFree( vPrio );
    return pNew;
}